

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O3

void __thiscall QAccessibleTabButton::doAction(QAccessibleTabButton *this,QString *actionName)

{
  long lVar1;
  char cVar2;
  long lVar3;
  QStringView QVar4;
  QStringView QVar5;
  
  cVar2 = (**(code **)(*(long *)this + 0x10))();
  if (cVar2 != '\0') {
    lVar3 = QAccessibleActionInterface::pressAction();
    lVar1 = (actionName->d).size;
    if (lVar1 == *(long *)(lVar3 + 0x10)) {
      QVar4.m_data = (actionName->d).ptr;
      QVar4.m_size = lVar1;
      QVar5.m_data = *(storage_type_conflict **)(lVar3 + 8);
      QVar5.m_size = lVar1;
      cVar2 = QtPrivate::equalStrings(QVar4,QVar5);
      if (cVar2 != '\0') {
        QTabBar::setCurrentIndex((QTabBar *)(this->m_parent).wp.value,this->m_index);
        return;
      }
    }
  }
  return;
}

Assistant:

void doAction(const QString &actionName) override
    {
        if (isValid() && actionName == pressAction())
            m_parent->setCurrentIndex(m_index);
    }